

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

_Bool test_matches_pattern(char *symbolic_name_pattern,TestItem *test_item)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *__pattern;
  char *__pattern_00;
  long in_RSI;
  int test_name_matches_test;
  char *test_name;
  int context_name_matches_test;
  char *context_name;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  __pattern = context_name_of((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
  ;
  iVar1 = fnmatch(__pattern,*(char **)(in_RSI + 8),0);
  __pattern_00 = test_name_of(in_stack_ffffffffffffffc8);
  iVar2 = fnmatch(__pattern_00,*(char **)(in_RSI + 0x10),0);
  uVar3 = (uint)(iVar2 == 0);
  free(__pattern);
  free(__pattern_00);
  return iVar1 == 0 && uVar3 != 0;
}

Assistant:

static bool test_matches_pattern(const char *symbolic_name_pattern,
                                 TestItem *test_item) {
    char* context_name = context_name_of(symbolic_name_pattern);
    int context_name_matches_test = fnmatch(context_name, test_item->context_name, 0) == 0;
    char* test_name = test_name_of(symbolic_name_pattern);
    int test_name_matches_test = fnmatch(test_name, test_item->test_name, 0) == 0;

    free(context_name);
    free(test_name);

    return context_name_matches_test && test_name_matches_test;
}